

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

void Gia_ManPrintBarBufDrivers(Gia_Man_t *p)

{
  int *piVar1;
  undefined8 uVar2;
  uint *__ptr;
  void *__s;
  Vec_Int_t *__ptr_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int Entry;
  ulong uVar12;
  int iVar13;
  int CountFans [2];
  int CountCrit [2];
  void *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  local_48 = 0;
  local_50 = 0;
  uVar5 = p->nObjs;
  local_40 = (ulong)uVar5;
  uVar6 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar6 = uVar5;
  }
  if (uVar6 == 0) {
    __ptr = (uint *)malloc(0x10);
    puVar8 = __ptr + 1;
    *__ptr = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar5;
    local_58 = (void *)0x0;
  }
  else {
    lVar11 = (long)(int)uVar5;
    local_58 = malloc((long)(int)uVar6 << 2);
    if (local_58 != (void *)0x0) {
      memset(local_58,0,lVar11 * 4);
    }
    __ptr = (uint *)malloc(0x10);
    puVar8 = __ptr + 1;
    *__ptr = uVar6;
    __s = malloc((long)(int)uVar6 << 2);
    *(void **)(__ptr + 2) = __s;
    uVar5 = (uint)local_40;
    __ptr[1] = uVar5;
    if (__s != (void *)0x0) {
      memset(__s,0,lVar11 << 2);
    }
  }
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 100;
  __ptr_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  __ptr_00->pArray = piVar3;
  uVar12 = 0;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  else {
    pGVar4 = p->pObjs;
    local_38 = __ptr_00;
    if (pGVar4 != (Gia_Obj_t *)0x0) {
      iVar13 = 0;
      uVar12 = 0;
      do {
        uVar9 = *(ulong *)pGVar4;
        uVar6 = (uint)uVar9;
        uVar5 = uVar6 & 0x1fffffff;
        Entry = (int)uVar12;
        if (((((int)uVar6 < 0) || (uVar5 == 0x1fffffff)) ||
            (uVar5 != ((uint)(uVar9 >> 0x20) & 0x1fffffff))) &&
           ((uVar9 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar6)) {
          if (-1 < (int)uVar6 && (int)(uVar9 & 0x1fffffff) != 0x1fffffff) {
            iVar7 = (int)(-uVar5 + uVar12);
            if ((iVar7 < 0) || (uVar6 = *puVar8, (int)uVar6 <= iVar7)) {
LAB_008691da:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            lVar11 = *(long *)(__ptr + 2);
            piVar3 = (int *)(lVar11 + (-uVar5 + uVar12 & 0xffffffff) * 4);
            *piVar3 = *piVar3 + 1;
            uVar9 = -(*(uint *)&pGVar4->field_0x4 & 0x1fffffff) + uVar12;
            if (((int)(uint)uVar9 < 0) || (uVar6 <= (uint)uVar9)) goto LAB_008691da;
            goto LAB_00868faf;
          }
        }
        else {
          if (((int)(Entry - uVar5) < 0) || ((int)*puVar8 <= (int)(Entry - uVar5)))
          goto LAB_008691da;
          uVar9 = (ulong)(Entry - uVar5);
          lVar11 = *(long *)(__ptr + 2);
LAB_00868faf:
          piVar3 = (int *)(lVar11 + (uVar9 & 0xffffffff) * 4);
          *piVar3 = *piVar3 + 1;
        }
        uVar5 = (uint)*(ulong *)pGVar4;
        if (((-1 < (int)uVar5) && (uVar6 = uVar5 & 0x1fffffff, uVar6 != 0x1fffffff)) &&
           (uVar6 == ((uint)(*(ulong *)pGVar4 >> 0x20) & 0x1fffffff))) {
          if (uVar12 != (uVar5 & 0x1fffffff)) {
            uVar6 = Entry - uVar6;
            if ((uint)local_40 <= uVar6) goto LAB_008691f9;
            if (*(int *)((long)local_58 + (ulong)uVar6 * 4) == 0) {
              *(uint *)((long)local_58 + (ulong)uVar6 * 4) =
                   iVar13 + (uint)((uVar5 >> 0x1d & 1) != 0);
              goto LAB_0086901b;
            }
          }
          piVar3 = (int *)((long)&local_48 + (ulong)(uVar12 != (uVar5 & 0x1fffffff)) * 4);
          *piVar3 = *piVar3 + 1;
          Vec_IntPush(local_38,Entry);
        }
LAB_0086901b:
        uVar12 = uVar12 + 1;
        uVar5 = p->nObjs;
        if ((long)(int)uVar5 <= (long)uVar12) break;
        pGVar4 = p->pObjs + uVar12;
        iVar13 = iVar13 + 2;
      } while (p->pObjs != (Gia_Obj_t *)0x0);
    }
    iVar13 = local_38->nSize;
    uVar9 = 0;
    uVar12 = 0;
    __ptr_00 = local_38;
    if (0 < (long)iVar13) {
      piVar3 = local_38->pArray;
      lVar11 = 0;
      do {
        uVar6 = piVar3[lVar11];
        if (((long)(int)uVar6 < 0) || ((int)uVar5 <= (int)uVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar2 = *(undefined8 *)(p->pObjs + (int)uVar6);
        uVar10 = (uint)uVar2;
        if ((((int)uVar10 < 0) || (uVar10 = uVar10 & 0x1fffffff, uVar10 == 0x1fffffff)) ||
           (uVar10 != ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))) {
          __assert_fail("Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                        ,0xf8,"void Gia_ManPrintBarBufDrivers(Gia_Man_t *)");
        }
        if ((int)*puVar8 <= lVar11) {
LAB_008691f9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)(*(long *)(__ptr + 2) + lVar11 * 4) != 0) {
          piVar1 = (int *)((long)&local_50 + (ulong)(uVar6 != uVar10) * 4);
          *piVar1 = *piVar1 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (iVar13 != lVar11);
      uVar9 = local_50 & 0xffffffff;
      uVar12 = local_50 >> 0x20;
    }
  }
  printf("Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n",uVar9,
         local_48 & 0xffffffff,uVar12,local_48 >> 0x20);
  if (local_58 != (void *)0x0) {
    free(local_58);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  return;
}

Assistant:

void Gia_ManPrintBarBufDrivers( Gia_Man_t * p )
{
    Vec_Int_t * vMap, * vFan, * vCrits;
    Gia_Obj_t * pObj;
    int i, iFanin, CountCrit[2] = {0}, CountFans[2] = {0};
    // map barbuf drivers into barbuf literals of the first barbuf driven by them
    vMap = Vec_IntStart( Gia_ManObjNum(p) );
    vFan = Vec_IntStart( Gia_ManObjNum(p) );
    vCrits = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        // count fanouts
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjIsCo(pObj) )
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId1(pObj, i), 1 );
        }
        // count critical barbufs
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0( pObj, i );
            if ( iFanin == 0 || Vec_IntEntry(vMap, iFanin) != 0 )
            {
                CountCrit[(int)(iFanin != 0)]++;
                Vec_IntPush( vCrits, i );
                continue;
            }
            Vec_IntWriteEntry( vMap, iFanin, Abc_Var2Lit(i, Gia_ObjFaninC0(pObj)) );
        }
    }
    // check fanouts of the critical barbufs
    Gia_ManForEachObjVec( vCrits, p, pObj, i )
    {
        assert( Gia_ObjIsBuf(pObj) );
        if ( Vec_IntEntry(vFan, i) == 0 )
            continue;
        iFanin = Gia_ObjFaninId0p( p, pObj );
        CountFans[(int)(iFanin != 0)]++;
    }
    printf( "Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n", 
        CountFans[0], CountCrit[0], CountFans[1], CountCrit[1] );
    Vec_IntFree( vMap );
    Vec_IntFree( vFan );
    Vec_IntFree( vCrits );
}